

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

shared_ptr<ASTNode> __thiscall SchemeInt::to_AST(SchemeInt *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  shared_ptr<ASTNode> sVar1;
  undefined1 local_3c [36];
  
  local_3c._0_4_ = 2;
  (**(code **)(*in_RSI + 0x10))(local_3c + 4);
  std::make_shared<ASTNode,ast_type_t,std::__cxx11::string>
            ((ast_type_t *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c);
  std::__cxx11::string::~string((string *)(local_3c + 4));
  sVar1.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ASTNode>)sVar1.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ASTNode> SchemeInt::to_AST() const
{
    return std::make_shared<ASTNode>(ast_type_t::INT, external_repr());
}